

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# softhsm2-keyconv-ossl.cpp
# Opt level: O0

void crypto_init(void)

{
  OPENSSL_init_crypto(0xc,0);
  return;
}

Assistant:

void crypto_init()
{
	OpenSSL_add_all_algorithms();
#ifdef WITH_FIPS
	if (!FIPS_mode_set(1))
	{
		fprintf(stderr, "ERROR: can't enter into FIPS mode.\n");
		exit(0);
	}
#endif
}